

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartsWithTest.cpp
# Opt level: O1

void __thiscall
oout::StartsWithTest::StartsWithTest(StartsWithTest *this,shared_ptr<const_oout::Text> *a,string *b)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined1 local_41;
  MatchTest *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  shared_ptr<oout::StartsWithMatch> local_30;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__StartsWithTest_00199230;
  local_30.super___shared_ptr<oout::StartsWithMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::StartsWithMatch,std::allocator<oout::StartsWithMatch>,std::__cxx11::string_const&>
            (&local_30.super___shared_ptr<oout::StartsWithMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(StartsWithMatch **)&local_30,
             (allocator<oout::StartsWithMatch> *)&local_41,b);
  local_40 = (MatchTest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::MatchTest,std::allocator<oout::MatchTest>,std::shared_ptr<oout::Text_const>const&,std::shared_ptr<oout::StartsWithMatch>>
            (&local_38,&local_40,(allocator<oout::MatchTest> *)&local_41,a,&local_30);
  _Var1._M_pi = local_38._M_pi;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_40->super_Test;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  local_40 = (MatchTest *)0x0;
  if (local_30.super___shared_ptr<oout::StartsWithMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<oout::StartsWithMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

StartsWithTest::StartsWithTest(const shared_ptr<const Text> &a, const string &b)
	: test(make_shared<MatchTest>(a, make_shared<StartsWithMatch>(b)))
{
}